

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall
despot::util::tinyxml::TiXmlElement::Accept(TiXmlElement *this,TiXmlVisitor *visitor)

{
  TiXmlAttribute *pTVar1;
  TiXmlNode *pTVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  TiXmlAttribute *pTVar6;
  TiXmlNode **ppTVar7;
  
  pTVar1 = (this->attributeSet).sentinel.next;
  pTVar6 = (TiXmlAttribute *)0x0;
  if (pTVar1 != &(this->attributeSet).sentinel) {
    pTVar6 = pTVar1;
  }
  cVar3 = (**(code **)(*(long *)visitor + 0x20))(visitor,this,pTVar6);
  if (cVar3 != '\0') {
    ppTVar7 = &(this->super_TiXmlNode).firstChild;
    do {
      pTVar2 = *ppTVar7;
      if (pTVar2 == (TiXmlNode *)0x0) break;
      iVar5 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[0x11])(pTVar2,visitor);
      ppTVar7 = &pTVar2->next;
    } while ((char)iVar5 != '\0');
  }
  uVar4 = (**(code **)(*(long *)visitor + 0x28))(visitor,this);
  return (bool)uVar4;
}

Assistant:

bool TiXmlElement::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this, attributeSet.First())) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}